

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void freednsentry(void *freethis)

{
  long *plVar1;
  
  plVar1 = (long *)((long)freethis + 0x10);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 != 0) {
    return;
  }
  Curl_freeaddrinfo(*freethis);
  (*Curl_cfree)(freethis);
  return;
}

Assistant:

static void freednsentry(void *freethis)
{
  struct Curl_dns_entry *dns = (struct Curl_dns_entry *) freethis;
  DEBUGASSERT(dns && (dns->inuse>0));

  dns->inuse--;
  if(dns->inuse == 0) {
    Curl_freeaddrinfo(dns->addr);
    free(dns);
  }
}